

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::JitAllocatorBlock::JitAllocatorBlock
          (JitAllocatorBlock *this,JitAllocatorPool *pool,DualMapping mapping,size_t blockSize,
          uint32_t blockFlags,BitWord *usedBitVector,BitWord *stopBitVector,uint32_t areaSize)

{
  *(undefined8 *)&this->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  this->_pool = pool;
  (this->_mapping).rx = mapping.rx;
  (this->_mapping).rw = mapping.rw;
  this->_blockSize = blockSize;
  this->_flags = blockFlags;
  this->_areaSize = areaSize;
  this->_areaUsed = 0;
  this->_largestUnusedArea = 0;
  this->_searchStart = 0;
  this->_searchEnd = 0;
  this->_usedBitVector = usedBitVector;
  this->_stopBitVector = stopBitVector;
  clearBlock(this);
  return;
}

Assistant:

inline JitAllocatorBlock(
    JitAllocatorPool* pool,
    VirtMem::DualMapping mapping,
    size_t blockSize,
    uint32_t blockFlags,
    Support::BitWord* usedBitVector,
    Support::BitWord* stopBitVector,
    uint32_t areaSize) noexcept
    : ZoneTreeNodeT(),
      _pool(pool),
      _mapping(mapping),
      _blockSize(blockSize),
      _flags(blockFlags),
      _areaSize(areaSize),
      _areaUsed(0),          // Will be initialized by clearBlock().
      _largestUnusedArea(0), // Will be initialized by clearBlock().
      _searchStart(0),       // Will be initialized by clearBlock().
      _searchEnd(0),         // Will be initialized by clearBlock().
      _usedBitVector(usedBitVector),
      _stopBitVector(stopBitVector) {

    clearBlock();
  }